

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitCallIndirect(PrintExpressionContents *this,CallIndirect *curr)

{
  ostream *poVar1;
  bool bVar2;
  string_view local_48;
  string_view local_38;
  string_view local_28;
  CallIndirect *local_18;
  CallIndirect *curr_local;
  PrintExpressionContents *this_local;
  
  local_18 = curr;
  curr_local = (CallIndirect *)this;
  if ((curr->isReturn & 1U) == 0) {
    poVar1 = this->o;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_38,"call_indirect ");
    printMedium(poVar1,local_38);
  }
  else {
    poVar1 = this->o;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_28,"return_call_indirect ");
    printMedium(poVar1,local_28);
  }
  bVar2 = FeatureSet::hasReferenceTypes(&this->features);
  if (bVar2) {
    wasm::Name::print(&local_18->table,this->o);
    std::operator<<(this->o,' ');
  }
  std::operator<<(this->o,'(');
  poVar1 = this->o;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,"type ");
  printMinor(poVar1,local_48);
  printHeapTypeName(this,(HeapType)(local_18->heapType).id);
  std::operator<<(this->o,')');
  return;
}

Assistant:

void visitCallIndirect(CallIndirect* curr) {
    if (curr->isReturn) {
      printMedium(o, "return_call_indirect ");
    } else {
      printMedium(o, "call_indirect ");
    }

    if (features.hasReferenceTypes()) {
      curr->table.print(o);
      o << ' ';
    }

    o << '(';
    printMinor(o, "type ");

    printHeapTypeName(curr->heapType);

    o << ')';
  }